

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.hpp
# Opt level: O3

void __thiscall Args::Command::addArg(Command *this,ArgPtr *arg)

{
  int iVar1;
  __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  _Var2;
  logic_error *this_00;
  uint *local_40;
  undefined8 local_38;
  uint local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  iVar1 = (*((arg->_M_t).
             super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
             super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
             super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl)->_vptr_ArgIface[2])();
  if ((iVar1 == 0) && (*(int *)&(this->super_GroupIface).field_0x4c != 0)) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x30);
    local_40 = &local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Addition of commands to command with value is disallowed.","");
    std::logic_error::logic_error(this_00,"Please use desc() method of the exception.");
    *(undefined ***)this_00 = &PTR__BaseException_00118ba0;
    *(logic_error **)(this_00 + 0x10) = this_00 + 0x20;
    if (local_40 == &local_30) {
      *(uint *)(this_00 + 0x20) = local_30;
      *(undefined4 *)(this_00 + 0x24) = uStack_2c;
      *(undefined4 *)(this_00 + 0x28) = uStack_28;
      *(undefined4 *)(this_00 + 0x2c) = uStack_24;
    }
    else {
      *(uint **)(this_00 + 0x10) = local_40;
      *(ulong *)(this_00 + 0x20) = CONCAT44(uStack_2c,local_30);
    }
    *(undefined8 *)(this_00 + 0x18) = local_38;
    local_38 = 0;
    local_30 = local_30 & 0xffffff00;
    local_40 = &local_30;
    __cxa_throw(this_00,&BaseException::typeinfo,BaseException::~BaseException);
  }
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const>>
                    ((this->super_GroupIface).m_children.
                     super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->super_GroupIface).m_children.
                     super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,arg);
  if (_Var2._M_current !=
      (this->super_GroupIface).m_children.
      super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return;
  }
  if ((this->super_GroupIface).super_ArgIface.m_cmdLine != (CmdLine *)0x0) {
    (*((arg->_M_t).super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>.
       _M_t.super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
       super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl)->_vptr_ArgIface[0x12])();
  }
  std::
  vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>
  ::emplace_back<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>
            ((vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>
              *)&(this->super_GroupIface).m_children,arg);
  return;
}

Assistant:

void addArg( ArgPtr arg ) override
	{
		if( arg->type() == ArgType::Command && m_opt != ValueOptions::NoValue )
			throw BaseException( String( SL( "Addition of commands to command with "
				"value is disallowed." ) ) );

		if( std::find( m_children.cbegin(), m_children.cend(), arg ) ==
			m_children.cend() )
		{
			if( cmdLine() )
				arg->setCmdLine( cmdLine() );

			m_children.push_back( std::move( arg ) );
		}
	}